

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

ON_String __thiscall ON_String::ToUTF8(ON_String *this,char *buffer,int buffer_length)

{
  uint *sUTF32;
  bool bVar1;
  bool bVar2;
  Encoding EVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  ON_Internal_Empty_aString *pOVar7;
  int iVar8;
  int iVar9;
  size_t slen;
  ulong uVar10;
  uint error_status;
  ON_UnicodeShortCodePoint u;
  ON_Big5CodePoint big5_cp;
  int local_54;
  ON_SimpleArray<unsigned_int> utf32;
  
  if (buffer != (char *)0x0) {
    uVar10 = (ulong)(uint)buffer_length;
    if (buffer_length == -1) {
      uVar10 = 0;
      do {
        if (buffer[uVar10] == '\0') goto LAB_005c25d7;
        uVar10 = uVar10 + 1;
      } while (uVar10 != 0x7ffffffd);
      uVar10 = 0x7ffffffd;
    }
LAB_005c25d7:
    uVar4 = (uint)uVar10;
    if (0 < (int)uVar4) {
      utf32._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c860;
      utf32.m_a = (uint *)0x0;
      utf32.m_count = 0;
      utf32.m_capacity = 0;
      EVar3 = ProbableEncoding(buffer,uVar4);
      if (EVar3 - ASCII < 2) {
        ON_String(this,buffer,uVar4);
      }
      else if (EVar3 == SloppyUTF8) {
        ON_String((ON_String *)&big5_cp,buffer,uVar4);
        ON_wString::ON_wString((ON_wString *)&error_status,(ON_String *)&big5_cp);
        ON_String(this,(ON_wString *)&error_status);
        ON_wString::~ON_wString((ON_wString *)&error_status);
        ~ON_String((ON_String *)&big5_cp);
      }
      else {
        uVar6 = 0;
        if (EVar3 == BIG5andASCII) {
          iVar9 = utf32.m_capacity;
          if (-1 < (long)utf32._16_8_) {
            utf32._16_8_ = (ulong)(uint)utf32.m_capacity << 0x20;
          }
          if ((uint)iVar9 < uVar4) {
            ON_SimpleArray<unsigned_int>::SetCapacity(&utf32,uVar10 & 0xffffffff);
          }
          local_54 = 0;
          iVar9 = 0;
          do {
            if (buffer[iVar9] < '\0') {
              iVar8 = 1;
              if (iVar9 + 2 <= (int)uVar4) {
                big5_cp = ON_Big5CodePoint::Error;
                pcVar5 = ON_Big5CodePoint::Decode(buffer + iVar9,2,false,false,&big5_cp);
                iVar8 = 1;
                bVar2 = true;
                if ((pcVar5 == buffer + iVar9 + 2) &&
                   (bVar1 = ON_Big5CodePoint::IsValid(&big5_cp,false,false), bVar1)) {
                  u = ON_UnicodeShortCodePoint::CreateFromBig5
                                (&big5_cp,ON_UnicodeShortCodePoint::ReplacementCharacter);
                  bVar2 = ON_UnicodeShortCodePoint::IsReplacementCharacter(&u);
                  error_status = ON_UnicodeShortCodePoint::UnicodeCodePoint(&u);
                  ON_SimpleArray<unsigned_int>::Append(&utf32,&error_status);
                  local_54 = local_54 + (uint)bVar2;
                  iVar8 = 2;
                  bVar2 = false;
                }
                if (!bVar2) goto LAB_005c274d;
              }
              error_status = 0xfffd;
              ON_SimpleArray<unsigned_int>::Append(&utf32,&error_status);
              local_54 = local_54 + 1;
            }
            else {
              error_status = (int)buffer[iVar9];
              ON_SimpleArray<unsigned_int>::Append(&utf32,&error_status);
              iVar8 = 1;
            }
LAB_005c274d:
            iVar9 = iVar9 + iVar8;
          } while (iVar9 < (int)uVar4);
          uVar6 = local_54 * 2;
        }
        if ((utf32.m_count != 0) && (uVar6 <= (uint)utf32.m_count)) {
          error_status = 0;
          uVar4 = ON_ConvertUTF32ToUTF8
                            (0,utf32.m_a,utf32.m_count,(char *)0x0,0,&error_status,0xffffffff,0xfffd
                             ,(ON__UINT32 **)0x0);
          if (0 < (int)uVar4) {
            error_status = 0;
            ON_String(this);
            ReserveArray(this,(ulong)uVar4);
            SetLength(this,(ulong)uVar4);
            sUTF32 = utf32.m_a;
            iVar9 = utf32.m_count;
            CopyArray(this);
            pcVar5 = this->m_s;
            pOVar7 = &empty_astring;
            if (pcVar5 != (char *)0x0) {
              pOVar7 = (ON_Internal_Empty_aString *)(pcVar5 + -0xc);
            }
            if ((pOVar7->header).string_capacity < 1) {
              pcVar5 = (char *)0x0;
            }
            ON_ConvertUTF32ToUTF8
                      (0,sUTF32,iVar9,pcVar5,uVar4,&error_status,0xffffffff,0xfffd,
                       (ON__UINT32 **)0x0);
            goto LAB_005c28a6;
          }
        }
        ON_String(this,&EmptyString);
      }
LAB_005c28a6:
      ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&utf32);
      return (ON_String)(char *)this;
    }
  }
  ON_String(this,&EmptyString);
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_String::ToUTF8(
  const char* buffer,
  int buffer_length
)
{
  if (nullptr == buffer)
    return ON_String::EmptyString;
  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);
  if (buffer_length <= 0)
    return ON_String::EmptyString;

  unsigned bad_utf32_count = 0;
  ON_SimpleArray<ON__UINT32> utf32;

  const ON_String::Encoding e = ON_String::ProbableEncoding(buffer, buffer_length);
  switch (e)
  {
  case ON_String::Encoding::ASCII:
  case ON_String::Encoding::UTF8:
    return ON_String(buffer, buffer_length);
    break;

  case ON_String::Encoding::SloppyUTF8:
    // ON_String -> ON_wString cleans up the slop.
    // ON_wString -> ON_String converts the wchar_t UTF-X encoding to UTF-8.
    return ON_String(ON_wString(ON_String(buffer, buffer_length)));
    break;

  case ON_String::Encoding::BIG5andASCII:
    bad_utf32_count = Internal_Big5ToUTF32(buffer, buffer_length, utf32);
    break;

  default:
    break;
  }

  const unsigned utf32_count = utf32.UnsignedCount();
  if (utf32_count > 0 && utf32_count >= 2* bad_utf32_count)
  {
    unsigned int error_status = 0;
    const unsigned int error_mask = 0xFFFFFFFFu;
    const int utf8_count = ON_ConvertUTF32ToUTF8(
      false, // bTestByteOrder,
      utf32.Array(),
      utf32.Count(),
      nullptr, // char* sUTF8,
      0, // int sUTF8_count,
      &error_status,
      error_mask,
      ON_UnicodeCodePoint::ON_ReplacementCharacter,
      nullptr //const ON__UINT32 * *sNextUTF32
    );
    if (utf8_count > 0)
    {
      error_status = 0;
      ON_String utf8;
      utf8.ReserveArray(utf8_count);
      utf8.SetLength(utf8_count);
      ON_ConvertUTF32ToUTF8(
        false, // bTestByteOrder,
        utf32.Array(),
        utf32.Count(),
        utf8.Array(),
        utf8_count,
        &error_status,
        error_mask,
        ON_UnicodeCodePoint::ON_ReplacementCharacter,
        nullptr //const ON__UINT32 * *sNextUTF32
      );
      return utf8;
    }
  }

  return ON_String::EmptyString;
}